

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prepro.h
# Opt level: O2

void __thiscall
mp::
ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
::
PreprocessConstraint<mp::PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::OrId>>>
          (ConstraintPreprocessors<mp::FlatCvtImpl<mp::MIPFlatConverter,mip_converter_test::MIPInstanceBackend,mp::FlatModel<mp::DefaultFlatModelParams>>>
           *this,OrConstraint *con,
          PreprocessInfo<mp::CustomFunctionalConstraint<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::LogicalFunctionalConstraintTraits,_mp::OrId>_>
          *prepro)

{
  int *piVar1;
  int iVar2;
  pair<int,_int> pVar3;
  long lVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  int x;
  Arguments *__range4;
  vector<int,_std::allocator<int>_> arg1;
  int local_54;
  CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
  *local_50;
  _Vector_base<int,_std::allocator<int>_> local_48;
  
  uVar6 = -(ulong)(1.0 < prepro->ub_);
  prepro->lb_ = (double)(~-(ulong)(prepro->lb_ < 0.0) & (ulong)prepro->lb_);
  prepro->ub_ = (double)(~uVar6 & (ulong)prepro->ub_ | uVar6 & 0x3ff0000000000000);
  prepro->type_ = INTEGER;
  pVar3 = count_fixed_01<std::vector<int,std::allocator<int>>>
                    (this,&(con->
                           super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                           ).args_);
  if ((ulong)pVar3 >> 0x20 == 0) {
    lVar4 = (long)(con->
                  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(con->
                  super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                  ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start >> 2;
    iVar2 = pVar3.first;
    if ((int)lVar4 != iVar2) {
      if (iVar2 != 0) {
        local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_50 = &con->
                    super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
        ;
        std::vector<int,_std::allocator<int>_>::reserve
                  ((vector<int,_std::allocator<int>_> *)&local_48,lVar4 - iVar2);
        piVar1 = (con->
                 super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                 ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
        for (piVar5 = (con->
                      super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
                      ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start; piVar5 != piVar1; piVar5 = piVar5 + 1) {
          local_54 = *piVar5;
          if (1.0 <= *(double *)(*(long *)(this + 0x58) + (long)local_54 * 8)) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&local_48,&local_54);
          }
        }
        std::vector<int,_std::allocator<int>_>::operator=
                  (&local_50->args_,(vector<int,_std::allocator<int>_> *)&local_48);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_48);
      }
      if ((*(int *)(this + 0x2fc) != 0) && (*(int *)(this + 0x2e8) != 0)) {
        IntegrateNested<mp::CustomFunctionalConstraint<std::vector<int,std::allocator<int>>,std::array<int,0ul>,mp::LogicalFunctionalConstraintTraits,mp::OrId>>
                  (this,con);
      }
      piVar5 = (con->
               super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
               ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_start;
      piVar1 = (con->
               super_CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::array<int,_0UL>,_mp::OrId>
               ).args_.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
               ._M_finish;
      if (piVar5 == piVar1) {
        prepro->lb_ = (double)(-(ulong)(0.0 <= prepro->lb_) & (ulong)prepro->lb_);
        prepro->ub_ = (double)(-(ulong)(prepro->ub_ <= 0.0) & (ulong)prepro->ub_);
      }
      if ((long)piVar1 - (long)piVar5 != 4) {
        return;
      }
      prepro->result_var_ = *piVar5;
      return;
    }
    dVar8 = (double)(-(ulong)(0.0 <= prepro->lb_) & (ulong)prepro->lb_);
    dVar9 = (double)(-(ulong)(prepro->ub_ <= 0.0) & (ulong)prepro->ub_);
  }
  else {
    uVar6 = -(ulong)(prepro->lb_ < 1.0);
    uVar7 = -(ulong)(1.0 < prepro->ub_);
    dVar8 = (double)(uVar6 & 0x3ff0000000000000 | ~uVar6 & (ulong)prepro->lb_);
    dVar9 = (double)(uVar7 & 0x3ff0000000000000 | ~uVar7 & (ulong)prepro->ub_);
  }
  prepro->lb_ = dVar8;
  prepro->ub_ = dVar9;
  return;
}

Assistant:

void PreprocessConstraint(
      OrConstraint& con, PreprocessInfo& prepro) {
    prepro.narrow_result_bounds(0.0, 1.0);
    prepro.set_result_type( var::INTEGER );
    // Remove fixed variables for XPRESS (solvers/#61).
    auto n01 = count_fixed_01(con.GetArguments());
    if (n01.second) {               // OR = true
      prepro.narrow_result_bounds(1.0, 1.0);
      return;
    }
    if ((int)con.GetArguments().size() == n01.first) {
      prepro.narrow_result_bounds(0.0, 0.0);
      return;
    }
    if (n01.first) {
      std::vector<int> arg1;
      arg1.reserve(con.GetArguments().size() - n01.first);
      for (auto x: con.GetArguments()) {
        if (MPCD( ub(x) ) >= 1.0)    // not fixed
          arg1.push_back(x);
      }
      con.GetArguments() = arg1;
    }
    if (MPCD( IfPreproNestedAndsOrs() ))
      IntegrateNested(con);            // flatten nested
    if (con.GetArguments().empty())
      prepro.narrow_result_bounds(0.0, 0.0);  // empty disjunction
    if (1 == con.GetArguments().size())
      prepro.set_result_var(con.GetArguments()[0]);
  }